

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_median4
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  unique_color *puVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  uint16 uVar5;
  uint i;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_EAX;
  long lVar8;
  vec<3U,_float> *pvVar9;
  undefined8 *puVar10;
  unsigned_short temp;
  float fVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint j;
  int iVar16;
  ulong uVar17;
  uint i_7;
  uint i_5;
  long lVar18;
  uint i_10;
  undefined8 *puVar19;
  byte bVar20;
  uint j_1;
  dxt1_solution_coordinates dVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float dist2_1;
  float fVar27;
  float dist2;
  float fVar28;
  float fVar29;
  vec<3U,_float> result_2;
  fast_random rm;
  float new_weights [4];
  vec<3U,_float> result;
  vec3F means [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_120;
  dxt1_solution_coordinates local_11c [3];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_110 [2];
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  float local_f8 [6];
  ulong local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_9c;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined4 local_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_6c;
  long local_60;
  undefined8 *local_58;
  long local_50;
  float local_48;
  undefined8 uVar21;
  
  if ((this->m_unique_colors).m_size < 5) {
    uVar6 = (this->m_norm_unique_colors).m_size - 1;
    pvVar9 = (this->m_norm_unique_colors).m_p;
    puVar10 = &local_a8;
    uVar13 = 0;
    do {
      uVar14 = (ulong)uVar6;
      if ((int)uVar13 < (int)uVar6) {
        uVar14 = uVar13 & 0xffffffff;
      }
      *(float *)(puVar10 + 1) = pvVar9[uVar14].m_s[2];
      *puVar10 = *(undefined8 *)pvVar9[uVar14].m_s;
      uVar13 = uVar13 + 1;
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
    } while (uVar13 != 4);
  }
  else {
    lVar18 = 0;
    do {
      *(float *)((long)&local_d8 + lVar18 * 4) =
           low_color->m_s[lVar18] - (this->m_mean_norm_color).m_s[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_a0 = (float)uStack_d0;
    local_a8 = local_d8;
    lVar18 = 0;
    do {
      *(float *)((long)&local_d8 + lVar18 * 4) =
           high_color->m_s[lVar18] - (this->m_mean_norm_color).m_s[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_7c = (float)uStack_d0;
    local_84 = local_d8;
    lVar18 = 0;
    do {
      fVar23 = *(float *)((long)&local_a8 + lVar18 * 4);
      *(float *)((long)&local_d8 + lVar18 * 4) =
           (*(float *)((long)&local_84 + lVar18 * 4) - fVar23) * 0.33333334 + fVar23;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_94 = (float)uStack_d0;
    local_9c = local_d8;
    lVar18 = 0;
    do {
      fVar23 = *(float *)((long)&local_a8 + lVar18 * 4);
      *(float *)((long)&local_d8 + lVar18 * 4) =
           (*(float *)((long)&local_84 + lVar18 * 4) - fVar23) * 0.6666667 + fVar23;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_88 = (float)uStack_d0;
    local_90 = local_d8;
    fast_random::fast_random((fast_random *)&local_110[0].field_0);
    fVar23 = 1e+37;
    local_e0 = 0;
    fVar11 = 0.0;
    do {
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      uVar13 = (ulong)(this->m_unique_colors).m_size;
      fVar26 = 0.0;
      if (uVar13 != 0) {
        pvVar9 = (this->m_norm_unique_colors).m_p;
        puVar1 = (this->m_unique_colors).m_p;
        uVar14 = 0;
        do {
          lVar18 = 0;
          fVar28 = 0.0;
          do {
            fVar27 = *(float *)((long)&local_a8 + lVar18 * 4) - pvVar9->m_s[lVar18];
            fVar28 = fVar28 + fVar27 * fVar27;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          uVar15 = 0;
          uVar17 = 1;
          puVar10 = &local_9c;
          do {
            fVar27 = 0.0;
            lVar18 = 0;
            do {
              fVar29 = *(float *)((long)puVar10 + lVar18 * 4) - pvVar9->m_s[lVar18];
              fVar27 = fVar27 + fVar29 * fVar29;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (fVar27 < fVar28) {
              uVar15 = uVar17 & 0xffffffff;
              fVar28 = fVar27;
            }
            uVar17 = uVar17 + 1;
            puVar10 = (undefined8 *)((long)puVar10 + 0xc);
          } while (uVar17 != 4);
          fVar27 = (float)puVar1[uVar14].m_weight;
          lVar18 = 0;
          do {
            local_11c[lVar18] = (dxt1_solution_coordinates)(pvVar9->m_s[lVar18] * fVar27);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar18 = (long)(int)uVar15;
          lVar8 = 0;
          do {
            *(float *)((long)&local_d8 + lVar8 * 4 + lVar18 * 0xc) =
                 (float)local_11c[lVar8] + *(float *)((long)&local_d8 + lVar8 * 4 + lVar18 * 0xc);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          fVar26 = fVar26 + fVar28;
          local_f8[lVar18] = fVar27 + local_f8[lVar18];
          uVar14 = uVar14 + 1;
          pvVar9 = pvVar9 + 1;
        } while (uVar14 != uVar13);
      }
      uVar13 = 0;
      fVar28 = 0.0;
      bVar3 = false;
      uVar14 = 0;
      do {
        lVar18 = (long)&local_d8 + uVar13 * 0xc;
        while( true ) {
          iVar16 = (int)uVar14;
          fVar27 = local_f8[uVar13];
          if (fVar27 <= 0.0) break;
          lVar8 = 0;
          do {
            local_11c[lVar8] = (dxt1_solution_coordinates)(*(float *)(lVar18 + lVar8 * 4) / fVar27);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          (&local_a0)[uVar13 * 3] = local_11c[2];
          *(ulong *)((long)&local_a8 + uVar13 * 0xc) =
               CONCAT44(local_11c[1],CONCAT22(local_11c[0].m_high_color,local_11c[0].m_low_color));
          if (fVar28 < fVar27) {
            uVar14 = uVar13 & 0xffffffff;
          }
          iVar16 = (int)uVar14;
          if (fVar27 <= fVar28) {
            fVar27 = fVar28;
          }
          fVar28 = fVar27;
          uVar13 = uVar13 + 1;
          lVar18 = lVar18 + 0xc;
          if (uVar13 == 4) {
            if (bVar3) goto LAB_00176d51;
            fVar28 = fVar26 - fVar23;
            fVar23 = fVar26;
            if (1e-05 <= ABS(fVar28)) goto LAB_00176e5e;
            goto LAB_00176e6c;
          }
        }
        uVar13 = uVar13 + 1;
        bVar3 = true;
      } while (uVar13 != 4);
LAB_00176d51:
      if (fVar11 == 9.80909e-45) break;
      local_78 = fVar11;
      uVar13 = (ulong)(iVar16 + (int)local_e0 & 3);
      lVar18 = uVar13 * 0xc;
      puVar10 = &local_a8;
      uVar14 = 0;
      local_108 = uVar13;
      do {
        if ((local_f8[uVar14] == 0.0) && (!NAN(local_f8[uVar14]))) {
          if (uVar14 != uVar13) {
            lVar8 = 0;
            do {
              *(undefined4 *)((long)puVar10 + lVar8 * 4) =
                   *(undefined4 *)((long)&local_a8 + lVar8 * 4 + lVar18);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
          }
          lVar8 = 0;
          do {
            dVar22 = (dxt1_solution_coordinates)
                     fast_random::frand((fast_random *)&local_110[0].field_0,-0.00196,0.00196);
            local_11c[lVar8] = dVar22;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            *(float *)((long)puVar10 + lVar8 * 4) =
                 (float)local_11c[lVar8] + *(float *)((long)puVar10 + lVar8 * 4);
            lVar8 = lVar8 + 1;
            uVar13 = local_108;
          } while (lVar8 != 3);
        }
        uVar14 = uVar14 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while (uVar14 != 4);
      local_e0 = (ulong)((int)local_e0 + 1);
      fVar23 = 1e+37;
      fVar11 = local_78;
LAB_00176e5e:
      fVar11 = (float)((int)fVar11 + 1);
    } while (fVar11 != 1.12104e-44);
  }
LAB_00176e6c:
  lVar18 = 1;
  puVar10 = &local_a8;
  puVar19 = &local_9c;
  local_60 = 0;
  uVar21 = 0;
  do {
    local_60 = local_60 + 1;
    local_58 = puVar19;
    local_50 = lVar18;
    do {
      lVar8 = 0;
      do {
        *(float *)((long)&local_d8 + lVar8 * 4) =
             *(float *)((long)puVar10 + lVar8 * 4) + (this->m_mean_norm_color).m_s[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_e0 = uVar21;
      lVar8 = 0;
      do {
        local_f8[lVar8] =
             *(float *)((long)puVar19 + lVar8 * 4) + (this->m_mean_norm_color).m_s[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_108 = CONCAT44(local_108._4_4_,local_d8._4_4_);
      fVar23 = floorf((float)local_d8 * 31.0 + 0.5);
      uVar12 = (uint)fVar23;
      fVar23 = floorf((float)local_108 * 63.0 + 0.5);
      uVar7 = (uint)fVar23;
      uVar6 = 0xff;
      if (uVar12 < 0xff) {
        uVar6 = uVar12;
      }
      local_110[0]._0_1_ = (undefined1)uVar6;
      if ((int)uVar12 < 0) {
        local_110[0]._0_1_ = '\0';
      }
      uVar6 = 0xff;
      if (uVar7 < 0xff) {
        uVar6 = uVar7;
      }
      local_110[0]._1_1_ = (undefined1)uVar6;
      if ((int)uVar7 < 0) {
        local_110[0]._1_1_ = '\0';
      }
      local_110[0].field_0.a = 0xff;
      fStack_100 = local_f8[2] * 31.0 + 0.5;
      fStack_fc = (float)uStack_d0 * 31.0 + 0.5;
      local_108 = CONCAT44(local_f8[1] * 63.0 + 0.5,local_f8[0] * 31.0 + 0.5);
      local_78 = floorf(fStack_fc);
      fStack_74 = (float)extraout_XMM0_Db;
      fVar23 = floorf(fStack_100);
      uStack_6c = fStack_74;
      fStack_74 = local_78;
      local_78 = fVar23;
      local_48 = floorf((float)local_108);
      fVar23 = floorf(local_108._4_4_);
      uVar7 = (uint)local_48;
      uVar12 = (uint)fVar23;
      uVar24 = (uint)local_78;
      uVar25 = (uint)fStack_74;
      uVar6 = uVar25;
      if (0xfe < uVar25) {
        uVar6 = 0xff;
      }
      local_110[0]._2_1_ = (undefined1)uVar6;
      auVar2._4_4_ = uVar12;
      auVar2._0_4_ = uVar7;
      auVar2._8_4_ = uVar24;
      auVar2._12_4_ = uVar25;
      uVar6 = movmskps(extraout_EAX,auVar2);
      if ((uVar6 & 8) != 0) {
        local_110[0]._2_1_ = '\0';
      }
      if (0xfe < uVar7) {
        uVar7 = 0xff;
      }
      local_120.field_0.r = (uchar)uVar7;
      if ((uVar6 & 1) != 0) {
        local_120.field_0.r = '\0';
      }
      if (0xfe < uVar12) {
        uVar12 = 0xff;
      }
      local_120.field_0.g = (uchar)uVar12;
      if ((uVar6 & 2) != 0) {
        local_120.field_0.g = '\0';
      }
      if (0xfe < uVar24) {
        uVar24 = 0xff;
      }
      local_120.field_0.b = (uchar)uVar24;
      if ((uVar6 & 4) != 0) {
        local_120.field_0.b = '\0';
      }
      local_120.field_0.a = 0xff;
      uVar5 = dxt1_block::pack_color((color_quad_u8 *)&local_110[0].field_0,false,0x7f);
      local_11c[0].m_low_color = uVar5;
      local_11c[0].m_high_color =
           dxt1_block::pack_color((color_quad_u8 *)&local_120.field_0,false,0x7f);
      if (uVar5 < local_11c[0].m_high_color) {
        local_11c[0].m_low_color = local_11c[0].m_high_color;
        local_11c[0].m_high_color = uVar5;
      }
      bVar3 = evaluate_solution(this,local_11c,false);
      bVar20 = (byte)local_e0;
      uVar21 = CONCAT71((int7)(local_e0 >> 8),bVar20 | bVar3);
      lVar18 = lVar18 + 1;
      puVar19 = (undefined8 *)((long)puVar19 + 0xc);
    } while (lVar18 != 4);
    lVar18 = local_50 + 1;
    puVar10 = (undefined8 *)((long)puVar10 + 0xc);
    puVar19 = (undefined8 *)((long)local_58 + 0xc);
  } while (local_60 != 3);
  bVar4 = refine_solution(this,(uint)(this->m_pParams->m_quality == cCRNDXTQualityUber));
  return (bool)(bVar4 | bVar20 & 1 | bVar3);
}

Assistant:

bool dxt1_endpoint_optimizer::try_median4(const vec3F& low_color, const vec3F& high_color) {
  vec3F means[4];

  if (m_unique_colors.size() <= 4) {
    for (uint i = 0; i < 4; i++)
      means[i] = m_norm_unique_colors[math::minimum<int>(m_norm_unique_colors.size() - 1, i)];
  } else {
    means[0] = low_color - m_mean_norm_color;
    means[3] = high_color - m_mean_norm_color;
    means[1] = vec3F::lerp(means[0], means[3], 1.0f / 3.0f);
    means[2] = vec3F::lerp(means[0], means[3], 2.0f / 3.0f);

    fast_random rm;

    const uint cMaxIters = 8;
    uint reassign_rover = 0;
    float prev_total_dist = math::cNearlyInfinite;
    for (uint iter = 0; iter < cMaxIters; iter++) {
      vec3F new_means[4];
      float new_weights[4];
      utils::zero_object(new_means);
      utils::zero_object(new_weights);

      float total_dist = 0;

      for (uint i = 0; i < m_unique_colors.size(); i++) {
        const vec3F& v = m_norm_unique_colors[i];

        float best_dist = means[0].squared_distance(v);
        int best_index = 0;

        for (uint j = 1; j < 4; j++) {
          float dist = means[j].squared_distance(v);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = j;
          }
        }

        total_dist += best_dist;

        new_means[best_index] += v * (float)m_unique_colors[i].m_weight;
        new_weights[best_index] += (float)m_unique_colors[i].m_weight;
      }

      uint highest_index = 0;
      float highest_weight = 0;
      bool empty_cell = false;
      for (uint j = 0; j < 4; j++) {
        if (new_weights[j] > 0.0f) {
          means[j] = new_means[j] / new_weights[j];
          if (new_weights[j] > highest_weight) {
            highest_weight = new_weights[j];
            highest_index = j;
          }
        } else
          empty_cell = true;
      }

      if (!empty_cell) {
        if (fabs(total_dist - prev_total_dist) < .00001f)
          break;

        prev_total_dist = total_dist;
      } else
        prev_total_dist = math::cNearlyInfinite;

      if ((empty_cell) && (iter != (cMaxIters - 1))) {
        const uint ri = (highest_index + reassign_rover) & 3;
        reassign_rover++;

        for (uint j = 0; j < 4; j++) {
          if (new_weights[j] == 0.0f) {
            means[j] = means[ri];
            means[j] += vec3F::make_random(rm, -.00196f, .00196f);
          }
        }
      }
    }
  }

  bool improved = false;

  for (uint i = 0; i < 3; i++) {
    for (uint j = i + 1; j < 4; j++) {
      const vec3F v0(means[i] + m_mean_norm_color);
      const vec3F v1(means[j] + m_mean_norm_color);

      dxt1_solution_coordinates sc(
          color_quad_u8((int)floor(.5f + v0[0] * 31.0f), (int)floor(.5f + v0[1] * 63.0f), (int)floor(.5f + v0[2] * 31.0f), 255),
          color_quad_u8((int)floor(.5f + v1[0] * 31.0f), (int)floor(.5f + v1[1] * 63.0f), (int)floor(.5f + v1[2] * 31.0f), 255), false);

      sc.canonicalize();
      improved |= evaluate_solution(sc);
    }
  }

  improved |= refine_solution((m_pParams->m_quality == cCRNDXTQualityUber) ? 1 : 0);

  return improved;
}